

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O1

Curl_dns_entry * Curl_cache_addr(Curl_easy *data,Curl_addrinfo *addr,char *hostname,int port)

{
  CURLcode CVar1;
  char *__s;
  size_t sVar2;
  undefined8 *p;
  Curl_dns_entry *pCVar3;
  Curl_addrinfo *local_30;
  
  local_30 = addr;
  if ((((data->set).dns_shuffle_addresses == true) &&
      (CVar1 = Curl_shuffle_addr(data,&local_30), CVar1 != CURLE_OK)) ||
     (__s = create_hostcache_id(hostname,port), __s == (char *)0x0)) {
    return (Curl_dns_entry *)0x0;
  }
  sVar2 = strlen(__s);
  p = (undefined8 *)(*Curl_ccalloc)(1,0x18);
  if (p != (undefined8 *)0x0) {
    p[2] = 1;
    *p = local_30;
    time(p + 1);
    if (p[1] == 0) {
      p[1] = 1;
    }
    pCVar3 = (Curl_dns_entry *)Curl_hash_add((data->dns).hostcache,__s,sVar2 + 1,p);
    if (pCVar3 != (Curl_dns_entry *)0x0) {
      pCVar3->inuse = pCVar3->inuse + 1;
      goto LAB_0010b6c8;
    }
    (*Curl_cfree)(p);
  }
  pCVar3 = (Curl_dns_entry *)0x0;
LAB_0010b6c8:
  (*Curl_cfree)(__s);
  return pCVar3;
}

Assistant:

struct Curl_dns_entry *
Curl_cache_addr(struct Curl_easy *data,
                Curl_addrinfo *addr,
                const char *hostname,
                int port)
{
  char *entry_id;
  size_t entry_len;
  struct Curl_dns_entry *dns;
  struct Curl_dns_entry *dns2;

  /* shuffle addresses if requested */
  if(data->set.dns_shuffle_addresses) {
    CURLcode result = Curl_shuffle_addr(data, &addr);
    if(result)
      return NULL;
  }

  /* Create an entry id, based upon the hostname and port */
  entry_id = create_hostcache_id(hostname, port);
  /* If we can't create the entry id, fail */
  if(!entry_id)
    return NULL;
  entry_len = strlen(entry_id);

  /* Create a new cache entry */
  dns = calloc(1, sizeof(struct Curl_dns_entry));
  if(!dns) {
    free(entry_id);
    return NULL;
  }

  dns->inuse = 1;   /* the cache has the first reference */
  dns->addr = addr; /* this is the address(es) */
  time(&dns->timestamp);
  if(dns->timestamp == 0)
    dns->timestamp = 1;   /* zero indicates CURLOPT_RESOLVE entry */

  /* Store the resolved data in our DNS cache. */
  dns2 = Curl_hash_add(data->dns.hostcache, entry_id, entry_len + 1,
                       (void *)dns);
  if(!dns2) {
    free(dns);
    free(entry_id);
    return NULL;
  }

  dns = dns2;
  dns->inuse++;         /* mark entry as in-use */

  /* free the allocated entry_id */
  free(entry_id);

  return dns;
}